

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void hash_table_destroy(hash_table_t *table)

{
  hash_table_bucket_t *phVar1;
  hash_table_bucket_t *next;
  hash_table_t *table_local;
  
  while (table->allocs != (hash_table_bucket_t *)0x0) {
    phVar1 = table->allocs->next;
    free(table->allocs);
    table->allocs = phVar1;
  }
  table->n_items = 0;
  table->n_buckets = 0;
  table->allocs = (hash_table_bucket_t *)0x0;
  table->buckets = (hash_table_bucket_t *)0x0;
  table->free_buckets = (hash_table_bucket_t *)0x0;
  table->is_equal = (_func_int_void_ptr_void_ptr *)0x0;
  table->hash = (_func_size_t_void_ptr *)0x0;
  return;
}

Assistant:

void hash_table_destroy( hash_table_t * table )
{
    while( table->allocs )
    {
        hash_table_bucket_t * next = table->allocs->next;
        free(table->allocs);
        table->allocs = next;
    }
    table->n_items = 0;
    table->n_buckets = 0;
    table->allocs = NULL;
    table->buckets = NULL;
    table->free_buckets = NULL;
    table->is_equal = NULL;
    table->hash = NULL;
}